

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LLVMPointsToSet.h
# Opt level: O2

bool __thiscall dg::LLVMPointsToSet::isUnknownSingleton(LLVMPointsToSet *this)

{
  int iVar1;
  undefined4 extraout_var;
  
  iVar1 = (*((this->_impl)._M_t.
             super___uniq_ptr_impl<dg::LLVMPointsToSetImpl,_std::default_delete<dg::LLVMPointsToSetImpl>_>
             ._M_t.
             super__Tuple_impl<0UL,_dg::LLVMPointsToSetImpl_*,_std::default_delete<dg::LLVMPointsToSetImpl>_>
             .super__Head_base<0UL,_dg::LLVMPointsToSetImpl_*,_false>._M_head_impl)->
            _vptr_LLVMPointsToSetImpl[4])();
  if (CONCAT44(extraout_var,iVar1) == 1) {
    iVar1 = (**((this->_impl)._M_t.
                super___uniq_ptr_impl<dg::LLVMPointsToSetImpl,_std::default_delete<dg::LLVMPointsToSetImpl>_>
                ._M_t.
                super__Tuple_impl<0UL,_dg::LLVMPointsToSetImpl_*,_std::default_delete<dg::LLVMPointsToSetImpl>_>
                .super__Head_base<0UL,_dg::LLVMPointsToSetImpl_*,_false>._M_head_impl)->
               _vptr_LLVMPointsToSetImpl)();
    return SUB41(iVar1,0);
  }
  return false;
}

Assistant:

bool isUnknownSingleton() const { return isSingleton() && hasUnknown(); }